

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* util::Split<std::basic_string_view<char,std::char_traits<char>>>
            (Span<const_char> *sp,string_view separators)

{
  long lVar1;
  char **ppcVar2;
  size_type sVar3;
  undefined8 in_RSI;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *ret;
  char *start;
  char *it;
  Span<const_char> *in_stack_ffffffffffffff88;
  char **__args_1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this;
  size_type in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  this = in_RDI;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)in_stack_ffffffffffffff88);
  local_20 = (char **)Span<const_char>::begin(in_stack_ffffffffffffff88);
  while (__args_1 = local_20, ppcVar2 = (char **)Span<const_char>::end(in_stack_ffffffffffffff88),
        __args_1 != ppcVar2) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(uVar4,in_stack_ffffffffffffffc0),(char)((ulong)in_RSI >> 0x38),
                       in_stack_ffffffffffffffb8);
    if (sVar3 != 0xffffffffffffffff) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<char_const*&,char_const*&>(this,(char **)in_RDI,__args_1);
    }
    local_20 = (char **)((long)local_20 + 1);
  }
  std::
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  ::emplace_back<char_const*&,char_const*&>(this,(char **)in_RDI,__args_1);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

std::vector<T> Split(const Span<const char>& sp, std::string_view separators)
{
    std::vector<T> ret;
    auto it = sp.begin();
    auto start = it;
    while (it != sp.end()) {
        if (separators.find(*it) != std::string::npos) {
            ret.emplace_back(start, it);
            start = it + 1;
        }
        ++it;
    }
    ret.emplace_back(start, it);
    return ret;
}